

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O0

fdb_status sb_write(filemgr *file,size_t sb_no,err_log_callback *log_callback)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  uint64_t uVar6;
  uint64_t uVar7;
  uint64_t uVar8;
  uint64_t uVar9;
  uint64_t uVar10;
  uint64_t uVar11;
  uint uVar12;
  err_log_callback *in_RDX;
  FdbGcFunc *in_RSI;
  long in_RDI;
  char errno_msg [512];
  bool rsv_bmp_enabled;
  uint64_t sb_bmp_size;
  uint64_t sb_last_hdr_revnum;
  bid_t sb_last_hdr_bid;
  bid_t sb_cur_alloc_bid;
  uint64_t sb_revnum;
  fdb_status fs;
  size_t offset;
  size_t i;
  uint64_t num_docs;
  uint64_t enc_u64;
  uint32_t _crc;
  uint32_t crc;
  FdbGcFunc gc;
  uint8_t *buf;
  void *buf_aligned;
  int blocksize;
  int real_blocksize;
  int r;
  Func *in_stack_fffffffffffffc08;
  memory_order order;
  FdbGcFunc *in_stack_fffffffffffffc10;
  anon_class_8_1_2001e2f8 *in_stack_fffffffffffffc18;
  function<void_()> *in_stack_fffffffffffffc20;
  undefined1 local_308 [527];
  byte local_f9;
  uint64_t local_f8;
  uint64_t local_f0;
  uint64_t local_e8;
  uint64_t local_e0;
  uint64_t local_d8;
  fdb_status local_cc;
  long local_c8;
  ulong local_c0;
  size_t local_b8;
  ulong local_b0;
  uint local_a4;
  uint32_t local_a0;
  ulong **local_90;
  ulong *local_40;
  ulong *local_38;
  int local_2c;
  int local_28;
  int local_24;
  err_log_callback *local_20;
  FdbGcFunc *local_18;
  long local_10;
  fdb_status local_4;
  
  local_28 = *(int *)(in_RDI + 0x10);
  local_2c = *(int *)(in_RDI + 0x10) + -1;
  local_38 = (ulong *)0x0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  iVar3 = posix_memalign(&local_38,0x200,(ulong)*(uint *)(in_RDI + 0x10));
  if (iVar3 != 0) {
    local_38 = (ulong *)0x0;
  }
  local_40 = local_38;
  local_90 = &local_38;
  std::function<void()>::function<sb_write::__0,void>
            (in_stack_fffffffffffffc20,in_stack_fffffffffffffc18);
  FdbGcFunc::FdbGcFunc(in_stack_fffffffffffffc10,in_stack_fffffffffffffc08);
  std::function<void_()>::~function((function<void_()> *)0x182dd6);
  memset(local_40,0,(long)local_28);
  uVar1 = *(ulong *)(local_10 + 400);
  uVar12 = (uint)uVar1;
  local_b0 = uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
             (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
             (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
             (ulong)(uVar12 & 0xff00) << 0x28 | uVar1 << 0x38;
  *local_40 = local_b0;
  local_c8 = 8;
  local_d8 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar12 = (uint)local_d8;
  local_b0 = local_d8 >> 0x38 | (ulong)((uint)(local_d8 >> 0x28) & 0xff00) |
             (ulong)((uint)(local_d8 >> 0x18) & 0xff0000) | (local_d8 & 0xff00000000) >> 8 |
             (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
             (ulong)(uVar12 & 0xff00) << 0x28 | local_d8 << 0x38;
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  uVar4 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar5 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar6 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar7 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar8 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar9 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                              (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar10 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                               (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar11 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                               (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  local_b0 = uVar4 >> 0x38 | (ulong)((uint)(uVar5 >> 0x28) & 0xff00) |
             (ulong)((uint)(uVar6 >> 0x18) & 0xff0000) | (uVar7 & 0xff00000000) >> 8 |
             (ulong)((uint)uVar8 & 0xff000000) << 8 | (ulong)((uint)uVar9 & 0xff0000) << 0x18 |
             (ulong)((uint)uVar10 & 0xff00) << 0x28 | uVar11 << 0x38;
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  local_e0 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar12 = (uint)local_e0;
  local_b0 = local_e0 >> 0x38 | (ulong)((uint)(local_e0 >> 0x28) & 0xff00) |
             (ulong)((uint)(local_e0 >> 0x18) & 0xff0000) | (local_e0 & 0xff00000000) >> 8 |
             (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
             (ulong)(uVar12 & 0xff00) << 0x28 | local_e0 << 0x38;
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  local_e8 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar12 = (uint)local_e8;
  local_b0 = local_e8 >> 0x38 | (ulong)((uint)(local_e8 >> 0x28) & 0xff00) |
             (ulong)((uint)(local_e8 >> 0x18) & 0xff0000) | (local_e8 & 0xff00000000) >> 8 |
             (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
             (ulong)(uVar12 & 0xff00) << 0x28 | local_e8 << 0x38;
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  local_f0 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  uVar12 = (uint)local_f0;
  *(uint64_t *)((long)local_40 + local_c8) =
       local_f0 >> 0x38 | (ulong)((uint)(local_f0 >> 0x28) & 0xff00) |
       (ulong)((uint)(local_f0 >> 0x18) & 0xff0000) | (local_f0 & 0xff00000000) >> 8 |
       (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
       (ulong)(uVar12 & 0xff00) << 0x28 | local_f0 << 0x38;
  uVar1 = *(ulong *)(*(long *)(local_10 + 0x198) + 0xa0);
  uVar12 = (uint)uVar1;
  *(ulong *)((long)local_40 + local_c8 + 8) =
       uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
       (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
       (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
       (ulong)(uVar12 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(*(long *)(local_10 + 0x198) + 0xa8);
  uVar12 = (uint)uVar1;
  *(ulong *)((long)local_40 + local_c8 + 0x10) =
       uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
       (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
       (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
       (ulong)(uVar12 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(*(long *)(local_10 + 0x198) + 0x78);
  uVar12 = (uint)uVar1;
  *(ulong *)((long)local_40 + local_c8 + 0x18) =
       uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
       (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
       (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
       (ulong)(uVar12 & 0xff00) << 0x28 | uVar1 << 0x38;
  uVar1 = *(ulong *)(*(long *)(local_10 + 0x198) + 0x80);
  uVar12 = (uint)uVar1;
  local_b0 = uVar1 >> 0x38 | (ulong)((uint)(uVar1 >> 0x28) & 0xff00) |
             (ulong)((uint)(uVar1 >> 0x18) & 0xff0000) | (uVar1 & 0xff00000000) >> 8 |
             (ulong)(uVar12 & 0xff000000) << 8 | (ulong)(uVar12 & 0xff0000) << 0x18 |
             (ulong)(uVar12 & 0xff00) << 0x28 | uVar1 << 0x38;
  *(ulong *)((long)local_40 + local_c8 + 0x20) = local_b0;
  local_c8 = local_c8 + 0x28;
  local_f8 = atomic_get_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,
                                 (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20));
  local_b0 = local_f8 >> 0x38 | (local_f8 & 0xff000000000000) >> 0x28 |
             (local_f8 & 0xff0000000000) >> 0x18 | (local_f8 & 0xff00000000) >> 8 |
             (local_f8 & 0xff000000) << 8 | (local_f8 & 0xff0000) << 0x18 |
             (local_f8 & 0xff00) << 0x28 | local_f8 << 0x38;
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  local_f9 = 0;
  if ((*(long *)(*(long *)(local_10 + 0x198) + 0x88) != 0) &&
     (bVar2 = atomic_cas_uint32_t((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
                                  (uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20),
                                  (uint32_t)in_stack_fffffffffffffc08), bVar2)) {
    local_f9 = 1;
  }
  if ((local_f9 & 1) == 0) {
    local_b0 = 0;
  }
  else {
    local_b0 = *(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) >> 0x38 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) & 0xff000000000000) >>
               0x28 | (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) &
                      0xff0000000000) >> 0x18 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) & 0xff00000000) >> 8 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) & 0xff000000) << 8 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) & 0xff0000) << 0x18 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) & 0xff00) << 0x28 |
               *(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8) << 0x38;
  }
  *(ulong *)((long)local_40 + local_c8) = local_b0;
  local_c8 = local_c8 + 8;
  local_b8 = _bmp_size_to_num_docs(local_f8);
  for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
    local_b0 = *(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) >> 0x38 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) &
               0xff000000000000) >> 0x28 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) &
               0xff0000000000) >> 0x18 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) &
               0xff00000000) >> 8 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) &
               0xff000000) << 8 |
               (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) & 0xff0000)
               << 0x18 | (*(ulong *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) &
                         0xff00) << 0x28 |
               *(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x60) + local_c0 * 8) << 0x38;
    *(ulong *)((long)local_40 + local_c8) = local_b0;
    local_c8 = local_c8 + 8;
  }
  if ((local_f9 & 1) != 0) {
    local_b8 = _bmp_size_to_num_docs
                         (*(uint64_t *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 8));
    for (local_c0 = 0; local_c0 < local_b8; local_c0 = local_c0 + 1) {
      local_b0 = *(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                           local_c0 * 8) >> 0x38 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff000000000000) >> 0x28 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff0000000000) >> 0x18 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff00000000) >> 8 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff000000) << 8 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff0000) << 0x18 |
                 (*(ulong *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                            local_c0 * 8) & 0xff00) << 0x28 |
                 *(long *)(*(long *)(*(long *)(*(long *)(local_10 + 0x198) + 0x88) + 0x28) +
                          local_c0 * 8) << 0x38;
      *(ulong *)((long)local_40 + local_c8) = local_b0;
      local_c8 = local_c8 + 8;
    }
    atomic_store_uint32_t
              ((atomic<unsigned_int> *)in_stack_fffffffffffffc10,
               (uint32_t)((ulong)in_stack_fffffffffffffc08 >> 0x20),
               (memory_order)in_stack_fffffffffffffc08);
  }
  local_a0 = get_checksum(&in_stack_fffffffffffffc10->done,(size_t)in_stack_fffffffffffffc08,
                          CRC_UNKNOWN);
  order = (memory_order)((ulong)in_stack_fffffffffffffc08 >> 0x20);
  local_a4 = local_a0 >> 0x18 | (local_a0 & 0xff0000) >> 8 | (local_a0 & 0xff00) << 8 |
             local_a0 << 0x18;
  *(uint *)((long)local_40 + local_c8) = local_a4;
  *(undefined1 *)((long)local_40 + (long)local_2c) = 0xcc;
  local_24 = (**(code **)(*(long *)(local_10 + 0xe8) + 8))
                       (*(undefined4 *)(local_10 + 0x14),local_40,(long)local_28,
                        (long)local_18 * (long)local_28);
  if (local_24 == local_28) {
    atomic_incr_uint64_t((atomic<unsigned_long> *)in_stack_fffffffffffffc10,order);
    local_4 = FDB_RESULT_SUCCESS;
  }
  else {
    (**(code **)(*(long *)(local_10 + 0xe8) + 0x40))(local_308,0x200);
    local_cc = FDB_RESULT_SB_RACE_CONDITION;
    fdb_log_impl(local_20,2,FDB_RESULT_SB_RACE_CONDITION,
                 "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/superblock.cc"
                 ,"sb_write",0x553,"Failed to write the superblock (number: %lu), %s",local_18,
                 local_308);
    local_4 = local_cc;
    in_stack_fffffffffffffc10 = local_18;
  }
  FdbGcFunc::~FdbGcFunc(in_stack_fffffffffffffc10);
  return local_4;
}

Assistant:

fdb_status sb_write(struct filemgr *file, size_t sb_no,
                    err_log_callback * log_callback)
{
    int r;
    int real_blocksize = file->blocksize;
    int blocksize = file->blocksize - BLK_MARKER_SIZE;

    void* buf_aligned = nullptr;
    malloc_align(buf_aligned, FDB_SECTOR_SIZE, file->blocksize);
    uint8_t *buf = (uint8_t*)buf_aligned;
    FdbGcFunc gc([&](){ free_align(buf_aligned); });

    uint32_t crc, _crc;
    uint64_t enc_u64;
    uint64_t num_docs;
    size_t i, offset;
    fdb_status fs;

    memset(buf, 0x0, real_blocksize);

    offset = 0;
    // magic number
    enc_u64 = _endian_encode(file->version);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // revision number
    uint64_t sb_revnum = atomic_get_uint64_t(&file->sb->revnum);
    enc_u64 = _endian_encode(sb_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap's revision number
    enc_u64 = _endian_encode(atomic_get_uint64_t(&file->sb->bmp_revnum));
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // cur_alloc_bid
    bid_t sb_cur_alloc_bid = atomic_get_uint64_t(&file->sb->cur_alloc_bid);
    enc_u64 = _endian_encode(sb_cur_alloc_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // last header bid
    bid_t sb_last_hdr_bid = atomic_get_uint64_t(&file->sb->last_hdr_bid);
    enc_u64 = _endian_encode(sb_last_hdr_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // last header rev number
    uint64_t sb_last_hdr_revnum = atomic_get_uint64_t(&file->sb->last_hdr_revnum);
    enc_u64 = _endian_encode(sb_last_hdr_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // minimum active header revnum
    enc_u64 = _endian_encode(file->sb->min_live_hdr_revnum);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // minimum active header BID
    enc_u64 = _endian_encode(file->sb->min_live_hdr_bid);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // # initial free blocks
    enc_u64 = _endian_encode(file->sb->num_init_free_blocks);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // # free blocks
    enc_u64 = _endian_encode(file->sb->num_free_blocks);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap size
    uint64_t sb_bmp_size = atomic_get_uint64_t(&file->sb->bmp_size);
    enc_u64 = _endian_encode(sb_bmp_size);
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    bool rsv_bmp_enabled = false;

    if ( file->sb->rsv_bmp &&
         atomic_cas_uint32_t(&file->sb->rsv_bmp->status,
                             SB_RSV_READY, SB_RSV_WRITING) ) {
        rsv_bmp_enabled = true;
        // status becomes 'WRITING' so that switching will be postponed.
        // note that 'rsv_bmp' is not currently used yet so that
        // it won't block any other tasks except for switching.
    }

    // reserved bitmap size (0 if not exist)
    if (rsv_bmp_enabled) {
        enc_u64 = _endian_encode(file->sb->rsv_bmp->bmp_size);
    } else {
        enc_u64 = 0;
    }
    memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
    offset += sizeof(enc_u64);

    // bitmap doc offsets
    num_docs = _bmp_size_to_num_docs(sb_bmp_size);
    for (i=0; i<num_docs; ++i) {
        enc_u64 = _endian_encode(file->sb->bmp_doc_offset[i]);
        memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
        offset += sizeof(enc_u64);
    }

    // reserved bitmap doc offsets
    if (rsv_bmp_enabled) {
        num_docs = _bmp_size_to_num_docs(file->sb->rsv_bmp->bmp_size);
        for (i=0; i<num_docs; ++i) {
            enc_u64 = _endian_encode(file->sb->rsv_bmp->bmp_doc_offset[i]);
            memcpy(buf + offset, &enc_u64, sizeof(enc_u64));
            offset += sizeof(enc_u64);
        }

        atomic_store_uint32_t(&file->sb->rsv_bmp->status, SB_RSV_READY);
    }

    // CRC
    crc = get_checksum(buf, offset, file->crc_mode);
    _crc = _endian_encode(crc);
    memcpy(buf + offset, &_crc, sizeof(_crc));

    // set block marker
    memset(buf + blocksize, BLK_MARKER_SB, BLK_MARKER_SIZE);

    // directly write a block bypassing block cache
    r = file->ops->pwrite(file->fd, buf, real_blocksize, sb_no * real_blocksize);
    if (r != real_blocksize) {
        char errno_msg[512];
        file->ops->get_errno_str(errno_msg, 512);
        fs = FDB_RESULT_SB_RACE_CONDITION;
        fdb_log(log_callback, FDB_LOG_ERROR, fs,
                "Failed to write the superblock (number: %" _F64 "), %s",
                sb_no, errno_msg);
        return fs;
    }

    // increase superblock's revision number
    atomic_incr_uint64_t(&file->sb->revnum);
    return FDB_RESULT_SUCCESS;
}